

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathNodeSetRemove(xmlNodeSetPtr cur,int val)

{
  int iVar1;
  xmlNodePtr ns;
  int iVar2;
  long lVar3;
  
  if ((cur != (xmlNodeSetPtr)0x0) && (iVar2 = cur->nodeNr, val < iVar2)) {
    ns = cur->nodeTab[val];
    if ((ns != (xmlNodePtr)0x0) && (ns->type == XML_NAMESPACE_DECL)) {
      xmlXPathNodeSetFreeNs((xmlNsPtr)ns);
      iVar2 = cur->nodeNr;
    }
    iVar1 = iVar2 + -1;
    cur->nodeNr = iVar1;
    if (val < iVar1) {
      lVar3 = (long)val + 1;
      do {
        cur->nodeTab[lVar3 + -1] = cur->nodeTab[lVar3];
        lVar3 = lVar3 + 1;
      } while (iVar2 != lVar3);
    }
    cur->nodeTab[iVar1] = (xmlNodePtr)0x0;
  }
  return;
}

Assistant:

void
xmlXPathNodeSetRemove(xmlNodeSetPtr cur, int val) {
    if (cur == NULL) return;
    if (val >= cur->nodeNr) return;
    if ((cur->nodeTab[val] != NULL) &&
	(cur->nodeTab[val]->type == XML_NAMESPACE_DECL))
	xmlXPathNodeSetFreeNs((xmlNsPtr) cur->nodeTab[val]);
    cur->nodeNr--;
    for (;val < cur->nodeNr;val++)
        cur->nodeTab[val] = cur->nodeTab[val + 1];
    cur->nodeTab[cur->nodeNr] = NULL;
}